

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

GLchar * __thiscall
gl4cts::GLSL420Pack::LineContinuationTest::lineEndingsToStr
          (LineContinuationTest *this,LINE_ENDINGS line_ending)

{
  char *local_20;
  GLchar *result;
  LINE_ENDINGS line_ending_local;
  LineContinuationTest *this_local;
  
  if (line_ending == UNIX) {
    local_20 = "unix";
  }
  else {
    local_20 = "dos";
  }
  return local_20;
}

Assistant:

const GLchar* LineContinuationTest::lineEndingsToStr(LINE_ENDINGS line_ending) const
{
	const GLchar* result = 0;

	if (UNIX == line_ending)
	{
		result = "unix";
	}
	else
	{
		result = "dos";
	}

	return result;
}